

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O3

void __thiscall QXcbWindow::updateWmTransientFor(QXcbWindow *this)

{
  QDebug QVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  QXcbWindow *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  char local_98 [24];
  char *local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QPlatformSurface local_60 [8];
  undefined1 local_58 [12];
  xcb_window_t transientXcbParent;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  transientXcbParent = 0;
  QPlatformWindow::window();
  iVar2 = QWindow::type();
  if (iVar2 == 3) {
LAB_00171c56:
    QPlatformWindow::window();
    lVar3 = QWindow::transientParent();
    if (lVar3 == 0) {
LAB_00171e3a:
      transientXcbParent =
           QXcbConnection::clientLeader((QXcbConnection *)(this->super_QXcbObject).m_connection);
      if (transientXcbParent == 0) goto LAB_00171ec8;
    }
    else {
      lVar3 = QWindow::handle();
      if (lVar3 == 0) goto LAB_00171e3a;
      lVar3 = QWindow::handle();
      this_00 = (QXcbWindow *)(lVar3 + -0x20);
      if (lVar3 == 0) {
        this_00 = (QXcbWindow *)0x0;
      }
      plVar4 = (long *)QWindow::handle();
      transientXcbParent = (**(code **)(*plVar4 + 0x68))(plVar4);
      if (transientXcbParent == 0) goto LAB_00171e3a;
      registerWmTransientForChild(this_00,this);
      lcQpaXcbWindow();
      if (((byte)lcQpaXcbWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
         ) {
        local_98[0] = '\x02';
        local_98[1] = '\0';
        local_98[2] = '\0';
        local_98[3] = '\0';
        local_98[4] = '\0';
        local_98[5] = '\0';
        local_98[6] = '\0';
        local_98[7] = '\0';
        local_98[8] = '\0';
        local_98[9] = '\0';
        local_98[10] = '\0';
        local_98[0xb] = '\0';
        local_98[0xc] = '\0';
        local_98[0xd] = '\0';
        local_98[0xe] = '\0';
        local_98[0xf] = '\0';
        local_98[0x10] = '\0';
        local_98[0x11] = '\0';
        local_98[0x12] = '\0';
        local_98[0x13] = '\0';
        local_98[0x14] = '\0';
        local_98[0x15] = '\0';
        local_98[0x16] = '\0';
        local_98[0x17] = '\0';
        local_80 = lcQpaXcbWindow::category.name;
        QMessageLogger::debug();
        QVar1.stream = local_78.stream;
        QVar5.m_data = (storage_type *)0x27;
        QVar5.m_size = (qsizetype)&local_48;
        QString::fromUtf8(QVar5);
        QTextStream::operator<<((QTextStream *)QVar1.stream,&local_48);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_78.stream,' ');
        }
        *(int *)((QTextStream *)local_78.stream + 0x28) =
             *(int *)((QTextStream *)local_78.stream + 0x28) + 1;
        ::operator<<((Stream *)&local_68,(QPlatformSurface *)&local_70);
        QVar1.stream = local_68.stream;
        QVar6.m_data = (storage_type *)0x1d;
        QVar6.m_size = (qsizetype)&local_48;
        QString::fromUtf8(QVar6);
        QTextStream::operator<<((QTextStream *)QVar1.stream,&local_48);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_68.stream,' ');
        }
        *(int *)((QTextStream *)local_68.stream + 0x28) =
             *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
        ::operator<<((Stream *)local_58,local_60);
        QDebug::~QDebug((QDebug *)local_58);
        QDebug::~QDebug((QDebug *)local_60);
        QDebug::~QDebug(&local_68);
        QDebug::~QDebug(&local_70);
        QDebug::~QDebug(&local_78);
        if (transientXcbParent == 0) goto LAB_00171e3a;
      }
    }
    xcb_change_property((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                        m_xcbConnection,0,this->m_window,0x44,0x21,0x20,1,&transientXcbParent);
    lcQpaXcbWindow();
    if (((byte)lcQpaXcbWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_98[0] = '\x02';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      local_98[0x10] = '\0';
      local_98[0x11] = '\0';
      local_98[0x12] = '\0';
      local_98[0x13] = '\0';
      local_98[0x14] = '\0';
      local_98[0x15] = '\0';
      local_98[0x16] = '\0';
      local_98[0x17] = '\0';
      local_80 = lcQpaXcbWindow::category.name;
      QMessageLogger::debug
                (local_98,"0x%x added XCB_ATOM_WM_TRANSIENT_FOR 0x%x",(ulong)this->m_window);
    }
    if (transientXcbParent != 0) goto LAB_00171edd;
  }
  else {
    iVar2 = QWindow::type();
    if (iVar2 == 5) goto LAB_00171c56;
    iVar2 = QWindow::type();
    if (iVar2 == 0xb) goto LAB_00171c56;
    iVar2 = QWindow::type();
    if (iVar2 == 0xf) goto LAB_00171c56;
    iVar2 = QWindow::type();
    if (iVar2 == 0xd) goto LAB_00171c56;
    iVar2 = QWindow::type();
    if (iVar2 == 7) goto LAB_00171c56;
    iVar2 = QWindow::type();
    if (iVar2 == 9) goto LAB_00171c56;
  }
LAB_00171ec8:
  xcb_delete_property((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                      m_xcbConnection,this->m_window,0x44);
LAB_00171edd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbWindow::updateWmTransientFor()
{
    xcb_window_t transientXcbParent = XCB_NONE;
    if (isTransient(window())) {
        QWindow *tp = window()->transientParent();
        if (tp && tp->handle()) {
            QXcbWindow *handle = static_cast<QXcbWindow *>(tp->handle());
            transientXcbParent = tp->handle()->winId();
            if (transientXcbParent) {
                handle->registerWmTransientForChild(this);
                qCDebug(lcQpaXcbWindow) << Q_FUNC_INFO << static_cast<QPlatformWindow *>(handle)
                    << " registerWmTransientForChild " << static_cast<QPlatformWindow *>(this);
            }
        }
        // Default to client leader if there is no transient parent, else modal dialogs can
        // be hidden by their parents.
        if (!transientXcbParent)
            transientXcbParent = connection()->clientLeader();
        if (transientXcbParent) { // ICCCM 4.1.2.6
            xcb_change_property(xcb_connection(), XCB_PROP_MODE_REPLACE, m_window,
                                XCB_ATOM_WM_TRANSIENT_FOR, XCB_ATOM_WINDOW, 32,
                                1, &transientXcbParent);
            qCDebug(lcQpaXcbWindow, "0x%x added XCB_ATOM_WM_TRANSIENT_FOR 0x%x", m_window, transientXcbParent);
        }
    }
    if (!transientXcbParent)
        xcb_delete_property(xcb_connection(), m_window, XCB_ATOM_WM_TRANSIENT_FOR);
}